

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,MethodInvocation *method_invocation)

{
  string *__rhs;
  string *__lhs;
  NewScopeLayer *pNVar1;
  MethodExpression *pMVar2;
  pointer ppEVar3;
  NewScopeLayerTree *tree;
  bool bVar4;
  char cVar5;
  int index;
  ostream *poVar6;
  __shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ClassStorage *this_00;
  iterator iVar8;
  __shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  VariableValue *this_main;
  mapped_type *ppNVar10;
  Value *pVVar11;
  runtime_error *prVar12;
  Expression **expr;
  pointer ppEVar13;
  shared_ptr<PrimitiveSimpleObject> casted_var;
  mapped_type method;
  vector<Value_*,_std::allocator<Value_*>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  Symbol class_symbol;
  unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
  methods;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  Symbol local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  NewFunctionProcessingVisitor new_visitor;
  
  __rhs = &method_invocation->method_name_;
  poVar6 = std::operator<<((ostream *)&std::cout,(string *)__rhs);
  poVar6 = std::operator<<(poVar6," called!");
  std::endl<char,std::char_traits<char>>(poVar6);
  class_symbol.name_._M_dataplus._M_p = (pointer)&class_symbol.name_.field_2;
  class_symbol.name_._M_string_length = 0;
  class_symbol.name_.field_2._M_local_buf[0] = '\0';
  __lhs = &method_invocation->call_from_;
  bVar4 = std::operator==(__lhs,"this");
  pNVar1 = this->current_layer_;
  if (bVar4) {
    std::__cxx11::string::_M_assign((string *)&class_symbol);
  }
  else {
    std::__cxx11::string::string((string *)&local_1f8,(string *)__lhs);
    Symbol::Symbol((Symbol *)&new_visitor,&local_1f8);
    bVar4 = NewScopeLayer::HasVariable(pNVar1,(Symbol *)&new_visitor);
    std::__cxx11::string::~string((string *)&new_visitor);
    std::__cxx11::string::~string((string *)&local_1f8);
    if (!bVar4) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"Can\'t call methods from undeclared variable");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pNVar1 = this->current_layer_;
    std::__cxx11::string::string((string *)&local_218,(string *)__lhs);
    Symbol::Symbol((Symbol *)&new_visitor,&local_218);
    p_Var7 = &std::__detail::
              _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pNVar1->variables_,(key_type *)&new_visitor)->
              super___shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2> *)&methods,p_Var7);
    std::__cxx11::string::~string((string *)&new_visitor);
    std::__cxx11::string::~string((string *)&local_218);
    cVar5 = (*(code *)(*methods._M_h._M_buckets)[4]._M_nxt)();
    if (cVar5 != '\0') {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &new_visitor,"Can\'t call methods from array object: ",__lhs);
      std::runtime_error::runtime_error(prVar12,(string *)&new_visitor);
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::dynamic_pointer_cast<PrimitiveSimpleObject,PrimitiveObject>
              ((shared_ptr<PrimitiveObject> *)&casted_var);
    bVar4 = PrimitiveSimpleObject::IsClass
                      (casted_var.
                       super___shared_ptr<PrimitiveSimpleObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    if (!bVar4) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &new_visitor,"Can\'t call methods from non-class object: ",__lhs);
      std::runtime_error::runtime_error(prVar12,(string *)&new_visitor);
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    (**((casted_var.super___shared_ptr<PrimitiveSimpleObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_PrimitiveObject).super_Object._vptr_Object)(&local_238);
    Symbol::Symbol((Symbol *)&new_visitor,&local_238);
    std::__cxx11::string::_M_assign((string *)&class_symbol);
    std::__cxx11::string::~string((string *)&new_visitor);
    std::__cxx11::string::~string((string *)&local_238);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&casted_var.super___shared_ptr<PrimitiveSimpleObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&methods._M_h._M_bucket_count);
  }
  this_00 = ClassStorage::GetInstance();
  ClassStorage::GetMethods(&methods,this_00,&class_symbol);
  std::__cxx11::string::string((string *)&local_258,(string *)__rhs);
  Symbol::Symbol((Symbol *)&new_visitor,&local_258);
  iVar8 = std::
          _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Method>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&methods._M_h,(key_type *)&new_visitor);
  std::__cxx11::string::~string((string *)&new_visitor);
  std::__cxx11::string::~string((string *)&local_258);
  if (iVar8.super__Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<Method>_>,_true>.
      _M_cur != (__node_type *)0x0) {
    parameters.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    parameters.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    parameters.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    pMVar2 = method_invocation->arguments_list_;
    if (pMVar2 != (MethodExpression *)0x0) {
      ppEVar3 = (pMVar2->list_of_expressions_).
                super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppEVar13 = (pMVar2->list_of_expressions_).
                      super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppEVar13 != ppEVar3; ppEVar13 = ppEVar13 + 1
          ) {
        new_visitor.super_TemplateVisitor<Value_*>.super_Visitor._vptr_Visitor =
             (_func_int **)
             TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&(*ppEVar13)->super_Node);
        std::vector<Value*,std::allocator<Value*>>::emplace_back<Value*>
                  ((vector<Value*,std::allocator<Value*>> *)&parameters,(Value **)&new_visitor);
      }
    }
    std::__cxx11::string::string((string *)&local_278,(string *)__rhs);
    Symbol::Symbol((Symbol *)&new_visitor,&local_278);
    p_Var9 = &std::__detail::
              _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Method>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Method>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&methods,(key_type *)&new_visitor)->
              super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&method.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>,p_Var9);
    std::__cxx11::string::~string((string *)&new_visitor);
    std::__cxx11::string::~string((string *)&local_278);
    bVar4 = std::operator==(__lhs,"this");
    if (bVar4) {
      this_main = this->this_;
    }
    else {
      std::__cxx11::string::string((string *)&local_2b8,(string *)__lhs);
      Symbol::Symbol(&local_298,&local_2b8);
      index = FunctionTable::Get(&this->table_,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      pVVar11 = FrameEmulator::Get(&this->frame_,index);
      if (pVVar11 == (Value *)0x0) {
        this_main = (VariableValue *)0x0;
      }
      else {
        this_main = (VariableValue *)
                    __dynamic_cast(pVVar11,&Value::typeinfo,&VariableValue::typeinfo,0);
      }
    }
    tree = this->tree_;
    Symbol::GetName_abi_cxx11_(&local_2f8,&class_symbol);
    std::operator+(&local_370,&local_2f8,"$");
    std::operator+(&local_2d8,&local_370,__rhs);
    Symbol::Symbol((Symbol *)&casted_var,&local_2d8);
    ppNVar10 = std::__detail::
               _Map_base<Symbol,_std::pair<const_Symbol,_NewScopeLayer_*>,_std::allocator<std::pair<const_Symbol,_NewScopeLayer_*>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_NewScopeLayer_*>,_std::allocator<std::pair<const_Symbol,_NewScopeLayer_*>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&tree->layer_mapping_,(key_type *)&casted_var);
    NewFunctionProcessingVisitor(&new_visitor,tree,*ppNVar10,&method,this_main);
    std::__cxx11::string::~string((string *)&casted_var);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_2f8);
    FrameEmulator::SetParameters(&new_visitor.frame_,&parameters);
    FrameEmulator::SetParentFrame(&new_visitor.frame_,&this->frame_);
    Visit(&new_visitor,
          (method.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          method_declaration_);
    pVVar11 = FrameEmulator::GetReturnValue(&this->frame_);
    (this->super_TemplateVisitor<Value_*>).tos_value_ = pVVar11;
    ~NewFunctionProcessingVisitor(&new_visitor);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&method.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::_Vector_base<Value_*,_std::allocator<Value_*>_>::~_Vector_base
              (&parameters.super__Vector_base<Value_*,_std::allocator<Value_*>_>);
    std::
    _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Method>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&methods._M_h);
    std::__cxx11::string::~string((string *)&class_symbol);
    return;
  }
  prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_370,"Can\'t call ",__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&casted_var,
                 &local_370," from ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_visitor,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&casted_var,
                 __lhs);
  std::runtime_error::runtime_error(prVar12,(string *)&new_visitor);
  __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NewFunctionProcessingVisitor::Visit(MethodInvocation* method_invocation) {
  std::cout << method_invocation->method_name_ << " called!" << std::endl;

  Symbol class_symbol;
  if (method_invocation->call_from_ == "this") {
    class_symbol = current_layer_->class_symbol_;
  } else {
    if (!current_layer_->HasVariable(Symbol(method_invocation->call_from_))) {
      throw std::runtime_error("Can't call methods from undeclared variable");
    }

    auto variable =
        current_layer_->variables_[Symbol(method_invocation->call_from_)];
    if (variable->IsArray()) {
      throw std::runtime_error("Can't call methods from array object: " +
                               method_invocation->call_from_);
    }

    auto casted_var =
        std::dynamic_pointer_cast<PrimitiveSimpleObject>(variable);
    if (!casted_var->IsClass()) {
      throw std::runtime_error("Can't call methods from non-class object: " +
                               method_invocation->call_from_);
    }

    class_symbol = Symbol(casted_var->GetTypename());
  }

  auto methods = ClassStorage::GetInstance().GetMethods(class_symbol);
  if (methods.find(Symbol(method_invocation->method_name_)) == methods.end()) {
    throw std::runtime_error("Can't call " + method_invocation->method_name_ +
                             " from " + method_invocation->call_from_);
  }

  std::vector<Value*> parameters;
  if (method_invocation->arguments_list_) {
    for (auto&& expr :
         method_invocation->arguments_list_->list_of_expressions_) {
      parameters.emplace_back(Accept(expr));
    }
  }

  auto method = methods[Symbol(method_invocation->method_name_)];

  VariableValue* class_obj;
  if (method_invocation->call_from_ == "this") {
    class_obj = this_;
  } else {
    int index = table_.Get(Symbol(method_invocation->call_from_));
    class_obj = dynamic_cast<VariableValue*>(frame_.Get(index));
  }

  NewFunctionProcessingVisitor new_visitor(
      tree_,
      tree_->layer_mapping_[Symbol(class_symbol.GetName() + "$" +
                                   method_invocation->method_name_)],
      method, class_obj);

  new_visitor.SetParameters(parameters);
  new_visitor.GetFrame().SetParentFrame(&frame_);
  new_visitor.Visit(method->method_declaration_);
  tos_value_ = frame_.GetReturnValue();
}